

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStream.cc
# Opt level: O0

void __thiscall
avro::BufferCopyOutputStream::BufferCopyOutputStream
          (BufferCopyOutputStream *this,auto_ptr<avro::(anonymous_namespace)::BufferCopyOut> *out,
          size_t bufferSize)

{
  auto_ptr<avro::(anonymous_namespace)::BufferCopyOut> *paVar1;
  BufferCopyOut *pBVar2;
  BufferCopyOut *in_RDX;
  auto_ptr<avro::(anonymous_namespace)::BufferCopyOut> *in_RSI;
  auto_ptr<avro::(anonymous_namespace)::BufferCopyOut> *in_RDI;
  
  OutputStream::OutputStream((OutputStream *)in_RDI);
  in_RDI->_M_ptr = (BufferCopyOut *)&PTR__BufferCopyOutputStream_0030dc20;
  in_RDI[1]._M_ptr = in_RDX;
  paVar1 = in_RDI + 2;
  pBVar2 = (BufferCopyOut *)operator_new__((ulong)in_RDX);
  paVar1->_M_ptr = pBVar2;
  std::auto_ptr<avro::(anonymous_namespace)::BufferCopyOut>::auto_ptr(in_RDI,in_RSI);
  in_RDI[4]._M_ptr = in_RDI[2]._M_ptr;
  in_RDI[5]._M_ptr = in_RDI[1]._M_ptr;
  in_RDI[6]._M_ptr = (BufferCopyOut *)0x0;
  return;
}

Assistant:

BufferCopyOutputStream(auto_ptr<BufferCopyOut> out, size_t bufferSize) :
        bufferSize_(bufferSize),
        buffer_(new uint8_t[bufferSize]),
        out_(out),
        next_(buffer_),
        available_(bufferSize_), byteCount_(0) { }